

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_list(sexp ctx,sexp x,int depth,int defok)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 in_ECX;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  bool bVar3;
  sexp ctx_00;
  sexp ls;
  sexp n;
  undefined8 self;
  undefined8 ctx_01;
  undefined8 local_20;
  undefined4 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_20 = 0x43e;
  local_18 = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&stack0xffffffffffffffd0,0,0x10);
  n = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb8,0,0x10);
  self = &stack0xffffffffffffffe0;
  ctx_01 = (((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd0;
  ctx_00 = (sexp)&stack0xffffffffffffffc8;
  ls = (sexp)(((sexp)local_8)->value).context.saves;
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb8;
  local_20 = &DAT_0000023e;
  while( true ) {
    bVar3 = false;
    if ((local_10 & 3) == 0) {
      bVar3 = ((sexp)local_10)->tag == 6;
    }
    uVar1 = local_20;
    if (bVar3 == false) break;
    sexp_push_op(ctx_00,(sexp_conflict *)CONCAT17(bVar3,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    n = analyze(ctx,x,depth,defok);
    if ((((ulong)n & 3) == 0) && (uVar1 = n, n->tag == 0x13)) break;
    iVar2 = lambda_envp((sexp)local_8);
    if ((iVar2 != 0) && (iVar2 = nondefp(ctx_00), iVar2 != 0)) {
      local_18 = 0xffffffff;
    }
    (((sexp)local_20)->value).type.slots = (((sexp)local_10)->value).type.slots;
    (((sexp)local_20)->value).type.name = n;
    local_10 = (((sexp)local_10)->value).type.cpl;
  }
  local_20 = uVar1;
  if (((local_20 & 3) == 0) && (((sexp)local_20)->tag == 6)) {
    local_20 = sexp_nreverse_op((sexp)ctx_01,(sexp)self,(sexp_sint_t)n,ls);
  }
  (((sexp)local_8)->value).context.saves = (sexp_gc_var_t *)ctx_01;
  return (sexp)local_20;
}

Assistant:

static sexp analyze_list (sexp ctx, sexp x, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  for (res=SEXP_NULL; sexp_pairp(x); x=sexp_cdr(x)) {
    sexp_push(ctx, res, SEXP_FALSE);
    tmp = analyze(ctx, sexp_car(x), depth, defok);
    if (sexp_exceptionp(tmp)) {
      res = tmp;
      break;
    } else {
      if (lambda_envp(ctx) && nondefp(tmp)) defok = -1;  /* -1 to warn */
      sexp_pair_source(res) = sexp_pair_source(x);
      sexp_car(res) = tmp;
    }
  }
  if (sexp_pairp(res)) res = sexp_nreverse(ctx, res);
  sexp_gc_release2(ctx);
  return res;
}